

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O2

int duckdb::TryCastDecimalCInternal<int>(duckdb_result *source,idx_t col,idx_t row)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  int result_value;
  int local_4;
  
  local_4 = (int)((ulong)in_RAX >> 0x20);
  bVar1 = CastDecimalCInternal<int>(source,&local_4,col,row);
  iVar2 = 0;
  if (bVar1) {
    iVar2 = local_4;
  }
  return iVar2;
}

Assistant:

RESULT_TYPE TryCastDecimalCInternal(duckdb_result *source, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!CastDecimalCInternal<RESULT_TYPE>(source, result_value, col, row)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}